

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::DoesFileExistWithExtensions
               (char *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *headerExts)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  string hname;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = '\0';
  pbVar2 = (headerExts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = pbVar2;
    pbVar1 = (headerExts->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 == pbVar1) break;
    std::__cxx11::string::assign((char *)&local_50);
    std::__cxx11::string::append((char *)&local_50);
    std::__cxx11::string::append((string *)&local_50);
    bVar3 = cmsys::SystemTools::FileExists(local_50);
    pbVar2 = pbVar4 + 1;
  } while (!bVar3);
  std::__cxx11::string::~string((string *)&local_50);
  return pbVar4 != pbVar1;
}

Assistant:

bool cmSystemTools::DoesFileExistWithExtensions(
  const char* name,
  const std::vector<std::string>& headerExts)
{
  std::string hname;

  for( std::vector<std::string>::const_iterator ext = headerExts.begin();
       ext != headerExts.end(); ++ext )
    {
    hname = name;
    hname += ".";
    hname += *ext;
    if(cmSystemTools::FileExists(hname.c_str()))
      {
      return true;
      }
    }
  return false;
}